

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O2

int mixed_make_segment_queue(mixed_segment *segment)

{
  void *pvVar1;
  void *pvVar2;
  
  pvVar1 = (*mixed_calloc)(1,0x30);
  if (pvVar1 == (void *)0x0) {
    mixed_err(1);
  }
  else {
    *(undefined4 *)((long)pvVar1 + 0x28) = 2;
    pvVar2 = (*mixed_calloc)(2,8);
    *(void **)((long)pvVar1 + 0x20) = pvVar2;
    if (pvVar2 != (void *)0x0) {
      *(undefined4 *)((long)pvVar1 + 0x18) = 2;
      pvVar2 = (*mixed_calloc)(2,8);
      *(void **)((long)pvVar1 + 0x10) = pvVar2;
      if (pvVar2 != (void *)0x0) {
        segment->free = queue_segment_free;
        segment->mix = queue_segment_mix;
        segment->set_in = queue_segment_set_in;
        segment->set_out = queue_segment_set_out;
        segment->info = queue_segment_info;
        segment->get = queue_segment_get;
        segment->set = queue_segment_set;
        segment->data = pvVar1;
        return 1;
      }
    }
    mixed_err(1);
    if (*(void **)((long)pvVar1 + 0x20) != (void *)0x0) {
      (*mixed_free)(*(void **)((long)pvVar1 + 0x20));
    }
    if (*(void **)((long)pvVar1 + 0x10) != (void *)0x0) {
      (*mixed_free)(*(void **)((long)pvVar1 + 0x10));
    }
    (*mixed_free)(pvVar1);
  }
  return 0;
}

Assistant:

MIXED_EXPORT int mixed_make_segment_queue(struct mixed_segment *segment){
  struct queue_segment_data *data = mixed_calloc(1, sizeof(struct queue_segment_data));
  if(!data){ goto cleanup; }

  data->in_count = 2;
  data->in = mixed_calloc(2, sizeof(struct mixed_segment *));
  if(!data->in){ goto cleanup; }

  data->out_count = 2;
  data->out = mixed_calloc(2, sizeof(struct mixed_segment *));
  if(!data->out){ goto cleanup; }
  
  segment->free = queue_segment_free;
  segment->mix = queue_segment_mix;
  segment->set_in = queue_segment_set_in;
  segment->set_out = queue_segment_set_out;
  segment->info = queue_segment_info;
  segment->get = queue_segment_get;
  segment->set = queue_segment_set;
  segment->data = data;
  return 1;

 cleanup:
  mixed_err(MIXED_OUT_OF_MEMORY);
  if(data){
    if(data->in) mixed_free(data->in);
    if(data->out) mixed_free(data->out);
    mixed_free(data);
  }
  return 0;
}